

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  SUNContext pSVar4;
  int iVar5;
  int iVar6;
  N_Vector p_Var7;
  void *flagvalue;
  undefined8 uVar8;
  int *jig;
  ushort uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  int *jr;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  undefined4 uVar20;
  uint uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  int flag;
  undefined4 local_138;
  char local_132;
  char local_131;
  int flag_1;
  undefined4 uStack_12c;
  N_Vector local_128;
  int local_11c;
  int local_118;
  int local_114;
  void *local_110;
  SUNContext ctx;
  int local_100;
  int local_fc;
  void *arkode_mem;
  long local_f0;
  void *local_e8;
  sunrealtype hu;
  long nni;
  long nfi;
  long nfe;
  long nst;
  sunrealtype t;
  long nfeLS;
  long nli;
  long nni_1;
  char *local_98;
  void *local_90;
  sunrealtype local_88;
  long ncfl;
  long nps;
  long npe;
  long netf;
  long ncfn;
  long nsetups;
  long nfi_1;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  arkode_mem = (void *)0x0;
  iVar6 = 0;
  flag = SUNContext_Create(0,&ctx);
  local_114 = 1;
  iVar5 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar5 == 0) {
    if (1 < argc) {
      iVar6 = atoi(argv[1]);
    }
    p_Var7 = (N_Vector)N_VNew_Serial(0xd8,ctx);
    iVar5 = check_flag(p_Var7,"N_VNew_Serial",0);
    pSVar4 = ctx;
    if (iVar5 == 0) {
      local_128 = p_Var7;
      flagvalue = malloc(0x990);
      for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
        uVar8 = SUNDlsMat_newDenseMat(6,6);
        *(undefined8 *)((long)flagvalue + lVar16 * 8) = uVar8;
        uVar8 = SUNDlsMat_newIndexArray(6);
        *(undefined8 *)((long)flagvalue + lVar16 * 8 + 0x20) = uVar8;
      }
      uVar8 = N_VNew_Serial(0xd8,pSVar4);
      *(undefined8 *)((long)flagvalue + 0x980) = uVar8;
      uVar8 = N_VNew_Serial(0xd8,pSVar4);
      *(undefined8 *)((long)flagvalue + 0x978) = uVar8;
      iVar5 = check_flag(flagvalue,"AllocUserData",2);
      p_Var7 = local_128;
      if (iVar5 == 0) {
        *(undefined4 *)((long)flagvalue + 0x40) = 6;
        pvVar10 = flagvalue;
        for (lVar16 = 0; lVar16 != 6; lVar16 = lVar16 + 1) {
          for (lVar11 = 0xc0; lVar11 != 0x1e0; lVar11 = lVar11 + 0x30) {
            *(undefined8 *)((long)pvVar10 + lVar11) = 0;
          }
          pvVar10 = (void *)((long)pvVar10 + 8);
        }
        jig = (int *)((long)flagvalue + 0x150);
        jr = (int *)0x3fe0000000000000;
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          for (lVar11 = -0x90; lVar11 != 0; lVar11 = lVar11 + 0x30) {
            *(undefined8 *)((long)jig + lVar11 + 0x90) = 0x40c3880000000000;
            *(undefined8 *)((long)jig + lVar11 + 0x18) = 0xbea0c6f7a0b5ed8d;
          }
          *(undefined8 *)((long)flagvalue + lVar16 * 0x38 + 0xc0) = 0xbff0000000000000;
          *(undefined8 *)((long)flagvalue + (lVar16 + 3) * 0x38 + 0xc0) = 0xbff0000000000000;
          *(undefined8 *)((long)flagvalue + lVar16 * 8 + 0x1e0) = 0x3ff0000000000000;
          *(undefined8 *)((long)flagvalue + lVar16 * 8 + 0x1f8) = 0xbff0000000000000;
          *(undefined8 *)((long)flagvalue + lVar16 * 8 + 0x210) = 0x3ff0000000000000;
          *(undefined8 *)((long)flagvalue + lVar16 * 8 + 0x228) = 0x3fe0000000000000;
          jig = jig + 2;
        }
        *(undefined4 *)((long)flagvalue + 0x44) = 0x24;
        *(undefined8 *)((long)flagvalue + 0x2a0) = 0x3fc999999999999a;
        *(undefined8 *)((long)flagvalue + 0x2a8) = 0x3fc999999999999a;
        for (lVar16 = 0x42; lVar16 != 0x48; lVar16 = lVar16 + 1) {
          dVar25 = *(double *)((long)flagvalue + lVar16 * 8) / 0.04000000000000001;
          *(double *)((long)flagvalue + lVar16 * 8 + 0x30) = dVar25;
          *(double *)((long)flagvalue + lVar16 * 8 + 0x60) = dVar25;
        }
        *(undefined8 *)((long)flagvalue + 0x48) = 0x2400000006;
        *(undefined8 *)((long)flagvalue + 0x50) = 0x600000006;
        *(undefined8 *)((long)flagvalue + 0x2b0) = 0x3e50000000000000;
        *(undefined8 *)((long)flagvalue + 0x58) = 0x200000004;
        *(undefined8 *)((long)flagvalue + 0x60) = 0x2400000002;
        iVar5 = (int)flagvalue;
        SetGroups(iVar5 + 0x68,iVar5 + 0x80,(int *)((long)flagvalue + 0xb0),jig,
                  (int *)0x3fe0000000000000);
        SetGroups(iVar5 + 0x74,iVar5 + 0x98,(int *)((long)flagvalue + 0xb8),jig,jr);
        local_fc = *(int *)((long)flagvalue + 0x40);
        local_100 = *(int *)((long)flagvalue + 0x44);
        puts("\n\nDemonstration program for ARKODE - SPGMR linear solver\n");
        pvVar10 = (void *)0x0;
        printf("Food web problem with ns species, ns = %d\n",6);
        puts("Predator-prey interaction and diffusion on a 2-D square\n");
        printf("Matrix parameters: a = %.2g   e = %.2g   g = %.2g\n",0,0x40c3880000000000,
               0x3ea0c6f7a0b5ed8d);
        printf("b parameter = %.2g\n",0);
        printf("Diffusion coefficients: Dprey = %.2g   Dpred = %.2g\n",0,0x3fe0000000000000);
        printf("Rate parameter alpha = %.2g\n\n",0);
        printf("Mesh dimensions (mx,my) are %d, %d.  ",6,6);
        printf("Total system size is neq = %d \n\n",0xd8);
        printf("Tolerances: reltol = %.2g, abstol = %.2g \n\n",0x88e368f1,0x3ee4f8b588e368f1);
        puts("Preconditioning uses a product of:");
        printf("  (1) Gauss-Seidel iterations with ");
        printf("itmax = %d iterations, and\n",5);
        printf("  (2) interaction-only block-diagonal matrix ");
        puts("with block-grouping");
        printf("  Number of diagonal block groups = ngrp = %d",4);
        printf("  (ngx by ngy, ngx = %d, ngy = %d)\n",2);
        printf("\n\n--------------------------------------------------------------");
        puts("--------------");
        if (iVar6 == 2) {
          uVar21 = 0xbff00000;
        }
        else {
          uVar21 = 0;
        }
        local_f0 = (ulong)uVar21 << 0x20;
        if (iVar6 == 1) {
          local_f0 = 0x402d64d51e0db1c6;
        }
        local_114 = 1;
        iVar5 = 1;
        local_90 = flagvalue;
        while (iVar6 = 1, iVar5 != 3) {
          local_98 = "SUN_PREC_RIGHT";
          local_11c = iVar5;
          if (iVar5 == 1) {
            local_98 = "SUN_PREC_LEFT";
          }
          while (iVar6 != 3) {
            local_118 = iVar6;
            lVar16 = N_VGetArrayPointer();
            uVar21 = *(uint *)((long)flagvalue + 0x40);
            iVar5 = *(int *)((long)flagvalue + 0x44);
            dVar25 = *(double *)((long)flagvalue + 0x2a0);
            uVar12 = 0;
            if (0 < (int)uVar21) {
              uVar12 = (ulong)uVar21;
            }
            dVar1 = *(double *)((long)flagvalue + 0x2a8);
            for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
              dVar27 = (double)(int)lVar11 * dVar1;
              dVar27 = dVar27 * 4.0 * (1.0 - dVar27);
              lVar14 = lVar16;
              for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
                dVar28 = (double)(int)lVar15 * dVar25;
                dVar28 = dVar28 * 4.0 * (1.0 - dVar28);
                uVar17 = 0;
                while (uVar12 != uVar17) {
                  *(double *)(lVar14 + uVar17 * 8) =
                       (double)(int)(uVar17 + 1) * dVar28 * dVar28 * dVar27 * dVar27 + 10.0;
                  uVar17 = uVar17 + 1;
                }
                lVar14 = lVar14 + (long)(int)uVar21 * 8;
              }
              lVar16 = lVar16 + (long)iVar5 * 8;
            }
            bVar18 = local_11c == 1;
            printf("\n\nPreconditioner type is           jpre = %s\n",local_98);
            bVar19 = local_118 == 1;
            pcVar13 = "SUN_CLASSICAL_GS";
            if (bVar19) {
              pcVar13 = "SUN_MODIFIED_GS";
            }
            printf("\nGram-Schmidt method type is    gstype = %s\n\n\n",pcVar13);
            local_132 = bVar19 && bVar18;
            if (bVar19 && bVar18) {
              pvVar10 = (void *)ARKStepCreate(0,0,f,p_Var7,ctx);
              arkode_mem = pvVar10;
              iVar5 = check_flag(pvVar10,"ARKStepCreate",0);
              if (iVar5 != 0) {
                return local_114;
              }
              *(void **)((long)flagvalue + 0x988) = pvVar10;
              flag = ARKodeSetUserData(pvVar10,flagvalue);
              iVar5 = check_flag(&flag,"ARKodeSetUserData",1);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = ARKodeSStolerances(0x88e368f1,0x3ee4f8b588e368f1,pvVar10);
              iVar5 = check_flag(&flag,"ARKodeSStolerances",1);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = ARKodeSetMaxNumSteps(pvVar10,1000);
              iVar5 = check_flag(&flag,"ARKodeSetMaxNumSteps",1);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = ARKodeSetNonlinConvCoef(0xd2f1a9fc,pvVar10);
              iVar5 = check_flag(&flag,"ARKodeSetNonlinConvCoef",1);
              if (iVar5 != 0) {
                return local_114;
              }
              local_110 = pvVar10;
              pvVar10 = (void *)SUNLinSol_SPGMR(local_128,1,0,ctx);
              iVar5 = check_flag(pvVar10,"SUNLinSol_SPGMR",0);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = ARKodeSetLinearSolver(local_110,pvVar10,0);
              iVar5 = check_flag(&flag,"ARKodeSetLinearSolver",1);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = SUNLinSol_SPGMRSetGSType(pvVar10,1);
              iVar5 = check_flag(&flag,"SUNLinSol_SPGMRSetGSType",1);
              pvVar3 = local_110;
              if (iVar5 != 0) {
                return local_114;
              }
              flag = ARKodeSetEpsLin(0,local_110);
              iVar5 = check_flag(&flag,"ARKodeSetEpsLin",1);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = ARKodeSetPreconditioner(pvVar3,Precond,PSolve);
              iVar5 = check_flag(&flag,"ARKodeSetPreconditioner",1);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = ARKodeSetLSNormFactor((int)local_f0,pvVar3);
              iVar5 = check_flag(&flag,"ARKodeSetLSNormFactor",1);
              if (iVar5 != 0) {
                return local_114;
              }
              local_e8 = pvVar10;
              PrintAllSpecies(local_128,local_fc,local_100,0.0);
            }
            else {
              flag = ARKStepReInit(0,arkode_mem,0,f,p_Var7);
              iVar5 = check_flag(&flag,"ARKStepReInit",1);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = SUNLinSol_SPGMRSetPrecType(pvVar10,local_11c);
              iVar5 = check_flag(&flag,"SUNLinSol_SPGMRSetPrecType",1);
              if (iVar5 != 0) {
                return local_114;
              }
              flag = SUNLinSol_SPGMRSetGSType(pvVar10,local_118);
              iVar5 = check_flag(&flag,"SUNLinSol_SPGMRSetGSType",1);
              if (iVar5 != 0) {
                return local_114;
              }
              local_110 = arkode_mem;
              local_e8 = pvVar10;
            }
            iVar5 = 0;
            uVar9 = 1;
            uVar20 = 0xe2308c3a;
            uVar22 = 0x3e45798e;
            uVar23 = 0;
            uVar24 = 0;
            while( true ) {
              pvVar10 = local_110;
              if (iVar5 == -0x12) break;
              local_131 = (char)uVar9;
              local_48 = uVar20;
              uStack_44 = uVar22;
              uStack_40 = uVar23;
              uStack_3c = uVar24;
              flag = ARKodeEvolve(local_110,local_128,&t,1);
              local_88 = t;
              flag_1 = ARKodeGetNumSteps(pvVar10,&nst);
              check_flag(&flag_1,"ARKodeGetNumSteps",1);
              flag_1 = ARKodeGetNumRhsEvals(pvVar10,0,&nfe);
              check_flag(&flag_1,"ARKodeGetNumRhsEvals",1);
              flag_1 = ARKodeGetNumRhsEvals(pvVar10,1,&nfi);
              check_flag(&flag_1,"ARKodeGetNumRhsEvals",1);
              flag_1 = ARKodeGetNumNonlinSolvIters(pvVar10,&nni);
              check_flag(&flag_1,"ARKodeGetNumNonlinSolvIters",1);
              flag_1 = ARKodeGetLastStep(pvVar10,&hu);
              check_flag(&flag_1,"ARKodeGetLastStep",1);
              printf("t = %10.2e  nst = %ld  nfe = %ld  nfi = %ld  nni = %ld",SUB84(local_88,0),nst,
                     nfe,nfi,nni);
              printf("  hu = %11.2e\n\n",SUB84(hu,0));
              if (local_132 == '\x01' && (char)((char)(uVar9 / 3) * -3 + '\x01') == (char)iVar5) {
                PrintAllSpecies(local_128,local_fc,local_100,t);
              }
              iVar6 = check_flag(&flag,"ARKodeEvolve",1);
              dVar25 = (double)CONCAT44(uStack_44,local_48);
              auVar26._12_4_ = uStack_3c;
              auVar26._8_4_ = uStack_40;
              flagvalue = local_90;
              if (iVar6 != 0) break;
              auVar26._0_8_ = ~-(ulong)(0.9 < dVar25) & (ulong)(dVar25 * 10.0);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = (ulong)(dVar25 + 1.0) & -(ulong)(0.9 < dVar25);
              auVar26 = auVar26 | auVar2;
              iVar5 = iVar5 + -1;
              uVar9 = (ushort)(byte)(local_131 + 1);
              uVar20 = auVar26._0_4_;
              uVar22 = auVar26._4_4_;
              uVar23 = auVar26._8_4_;
              uVar24 = auVar26._12_4_;
            }
            pvVar10 = local_110;
            local_138 = ARKodeGetWorkSpace(local_110,&nst,&nfe);
            check_flag(&local_138,"ARKodeGetWorkSpace",1);
            local_138 = ARKodeGetNumSteps(pvVar10,&hu);
            check_flag(&local_138,"ARKodeGetNumSteps",1);
            local_138 = ARKodeGetNumRhsEvals(pvVar10,0,&flag_1);
            check_flag(&local_138,"ARKodeGetNumRhsEvals",1);
            local_138 = ARKodeGetNumRhsEvals(pvVar10,1,&nfi_1);
            check_flag(&local_138,"ARKodeGetNumRhsEvals",1);
            local_138 = ARKodeGetNumLinSolvSetups(pvVar10,&nsetups);
            check_flag(&local_138,"ARKodeGetNumLinSolvSetups",1);
            local_138 = ARKodeGetNumErrTestFails(pvVar10,&netf);
            check_flag(&local_138,"ARKodeGetNumErrTestFails",1);
            local_138 = ARKodeGetNumNonlinSolvIters(pvVar10,&nni_1);
            check_flag(&local_138,"ARKodeGetNumNonlinSolvIters",1);
            local_138 = ARKodeGetNumNonlinSolvConvFails(pvVar10,&ncfn);
            check_flag(&local_138,"ARKodeGetNumNonlinSolvConvFails",1);
            local_138 = ARKodeGetLinWorkSpace(pvVar10,&nfi,&nni);
            check_flag(&local_138,"ARKodeGetLinWorkSpace",1);
            local_138 = ARKodeGetNumLinIters(pvVar10,&nli);
            check_flag(&local_138,"ARKodeGetNumLinIters",1);
            local_138 = ARKodeGetNumPrecEvals(pvVar10,&npe);
            check_flag(&local_138,"ARKodeGetNumPrecEvals",1);
            local_138 = ARKodeGetNumPrecSolves(pvVar10,&nps);
            check_flag(&local_138,"ARKodeGetNumPrecSolves",1);
            local_138 = ARKodeGetNumLinConvFails(pvVar10,&ncfl);
            check_flag(&local_138,"ARKodeGetNumLinConvFails",1);
            local_138 = ARKodeGetNumLinRhsEvals(pvVar10,&nfeLS);
            check_flag(&local_138,"ARKodeGetNumLinRhsEvals",1);
            puts("\n\n Final statistics for this run:\n");
            printf(" ARKStep real workspace length         = %4ld \n",nst);
            printf(" ARKStep integer workspace length      = %4ld \n",nfe);
            printf(" ARKLS real workspace length           = %4ld \n",nfi);
            printf(" ARKLS integer workspace length        = %4ld \n",nni);
            printf(" Number of steps                       = %4ld \n",hu);
            printf(" Number of f-s (explicit)              = %4ld \n",CONCAT44(uStack_12c,flag_1));
            printf(" Number of f-s (implicit)              = %4ld \n",nfi_1);
            printf(" Number of f-s (SPGMR)                 = %4ld \n",nfeLS);
            printf(" Number of f-s (TOTAL)                 = %4ld \n",
                   nfeLS + CONCAT44(uStack_12c,flag_1));
            printf(" Number of setups                      = %4ld \n",nsetups);
            printf(" Number of nonlinear iterations        = %4ld \n",nni_1);
            printf(" Number of linear iterations           = %4ld \n",nli);
            printf(" Number of preconditioner evaluations  = %4ld \n",npe);
            printf(" Number of preconditioner solves       = %4ld \n",nps);
            printf(" Number of error test failures         = %4ld \n",netf);
            printf(" Number of nonlinear conv. failures    = %4ld \n",ncfn);
            printf(" Number of linear convergence failures = %4ld \n",ncfl);
            pvVar10 = local_e8;
            p_Var7 = local_128;
            if (nni_1 < 1) {
              uVar20 = 0;
            }
            else {
              uVar20 = SUB84((double)nli / (double)nni_1,0);
            }
            printf(" Average Krylov subspace dimension     = %.3f \n",uVar20);
            printf("\n\n--------------------------------------------------------------");
            puts("--------------");
            printf("--------------------------------------------------------------");
            puts("--------------");
            iVar6 = local_118 + 1;
          }
          iVar5 = local_11c + 1;
        }
        ARKodeFree(&arkode_mem);
        N_VDestroy(p_Var7);
        SUNLinSolFree(pvVar10);
        uVar17 = 0;
        uVar12 = (ulong)*(uint *)((long)flagvalue + 0x58);
        if ((int)*(uint *)((long)flagvalue + 0x58) < 1) {
          uVar12 = uVar17;
        }
        for (; uVar12 != uVar17; uVar17 = uVar17 + 1) {
          SUNDlsMat_destroyMat(*(undefined8 *)((long)flagvalue + uVar17 * 8));
          SUNDlsMat_destroyArray(*(undefined8 *)((long)flagvalue + uVar17 * 8 + 0x20));
        }
        N_VDestroy(*(undefined8 *)((long)flagvalue + 0x980));
        N_VDestroy(*(undefined8 *)((long)flagvalue + 0x978));
        free(flagvalue);
        SUNContext_Free(&ctx);
        local_114 = 0;
      }
    }
  }
  return local_114;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol = ATOL, reltol = RTOL, t, tout;
  N_Vector c         = NULL;
  WebData wdata      = NULL;
  SUNLinearSolver LS = NULL;
  void* arkode_mem   = NULL;
  sunbooleantype firstrun;
  int jpre, gstype, flag;
  int ns, mxns, iout;
  int nrmfactor = 0;  /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }

  /* Initializations */
  c = N_VNew_Serial(NEQ, ctx);
  if (check_flag((void*)c, "N_VNew_Serial", 0)) { return (1); }
  wdata = AllocUserData(ctx);
  if (check_flag((void*)wdata, "AllocUserData", 2)) { return (1); }
  InitUserData(wdata);
  ns   = wdata->ns;
  mxns = wdata->mxns;

  /* Print problem description */
  PrintIntro();

  /* Loop over jpre and gstype (four cases) */
  for (jpre = SUN_PREC_LEFT; jpre <= SUN_PREC_RIGHT; jpre++)
  {
    for (gstype = SUN_MODIFIED_GS; gstype <= SUN_CLASSICAL_GS; gstype++)
    {
      /* Initialize c and print heading */
      CInit(c, wdata);
      PrintHeader(jpre, gstype);

      /* Call ARKStepCreate or ARKStepReInit, then SPGMR to set up problem */

      firstrun = (jpre == SUN_PREC_LEFT) && (gstype == SUN_MODIFIED_GS);
      if (firstrun)
      {
        arkode_mem = ARKStepCreate(NULL, f, T0, c, ctx);
        if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return (1); }

        wdata->arkode_mem = arkode_mem;

        flag = ARKodeSetUserData(arkode_mem, wdata);
        if (check_flag(&flag, "ARKodeSetUserData", 1)) { return (1); }

        flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
        if (check_flag(&flag, "ARKodeSStolerances", 1)) { return (1); }

        flag = ARKodeSetMaxNumSteps(arkode_mem, 1000);
        if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return (1); }

        flag = ARKodeSetNonlinConvCoef(arkode_mem, 1.e-3);
        if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return (1); }

        LS = SUNLinSol_SPGMR(c, jpre, MAXL, ctx);
        if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

        flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL);
        if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }

        flag = SUNLinSol_SPGMRSetGSType(LS, gstype);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }

        flag = ARKodeSetEpsLin(arkode_mem, DELTA);
        if (check_flag(&flag, "ARKodeSetEpsLin", 1)) { return (1); }

        flag = ARKodeSetPreconditioner(arkode_mem, Precond, PSolve);
        if (check_flag(&flag, "ARKodeSetPreconditioner", 1)) { return (1); }

        /* Set the linear solver tolerance conversion factor */
        switch (nrmfactor)
        {
        case (1):
          /* use the square root of the vector length */
          nrmfac = SQRT((sunrealtype)NEQ);
          break;
        case (2):
          /* compute with dot product */
          nrmfac = -ONE;
          break;
        default:
          /* use the default */
          nrmfac = ZERO;
          break;
        }

        flag = ARKodeSetLSNormFactor(arkode_mem, nrmfac);
        if (check_flag(&flag, "ARKodeSetLSNormFactor", 1)) { return (1); }
      }
      else
      {
        flag = ARKStepReInit(arkode_mem, NULL, f, T0, c);
        if (check_flag(&flag, "ARKStepReInit", 1)) { return (1); }

        flag = SUNLinSol_SPGMRSetPrecType(LS, jpre);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetPrecType", 1)) { return (1); }

        flag = SUNLinSol_SPGMRSetGSType(LS, gstype);
        if (check_flag(&flag, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }
      }

      /* Print initial values */
      if (firstrun) { PrintAllSpecies(c, ns, mxns, T0); }

      /* Loop over output points, call ARKodeEvolve, print sample solution values. */
      tout = T1;
      for (iout = 1; iout <= NOUT; iout++)
      {
        flag = ARKodeEvolve(arkode_mem, tout, c, &t, ARK_NORMAL);
        PrintOutput(arkode_mem, t);
        if (firstrun && (iout % 3 == 0)) { PrintAllSpecies(c, ns, mxns, t); }
        if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
        if (tout > SUN_RCONST(0.9)) { tout += DTOUT; }
        else { tout *= TOUT_MULT; }
      }

      /* Print final statistics, and loop for next case */
      PrintFinalStats(arkode_mem);
    }
  }

  /* Free all memory */
  ARKodeFree(&arkode_mem);
  N_VDestroy(c);
  SUNLinSolFree(LS);
  FreeUserData(wdata);
  SUNContext_Free(&ctx);

  return (0);
}